

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O1

void save_load_header(vw *all,io_buf *model_file,bool read,bool text,string *file_options,
                     options_i *options)

{
  string *__rhs;
  pointer pbVar1;
  pointer pcVar2;
  size_type sVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  uint32_t uVar9;
  uint uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  ostream *poVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  long *plVar17;
  size_t sVar18;
  undefined8 *puVar19;
  vw_exception *pvVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  long *plVar22;
  byte *pbVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  byte bVar27;
  int iVar28;
  ulong uVar29;
  uint uVar30;
  vw *pvVar31;
  char cVar32;
  uint uVar33;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var34;
  char *pcVar35;
  long lVar36;
  shared_ptr<VW::config::base_option> *option;
  _Alloc_hider _Var37;
  uint32_t ngram_len;
  uint32_t len;
  char *buff2;
  uint32_t pair_len;
  uint32_t skip_len;
  uint32_t local_num_bits;
  char model;
  uint32_t triple_len;
  size_t buf2_size;
  stringstream temp;
  stringstream msg;
  undefined4 local_484;
  undefined8 local_480;
  vw *local_478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  string *local_448;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_440;
  version_struct *local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_430;
  long *local_428;
  long local_420;
  long local_418;
  long lStack_410;
  uint local_404;
  uint32_t local_400;
  char local_3f9;
  options_i *local_3f8;
  char *local_3f0;
  uint local_3e8;
  char local_3e0 [16];
  size_t local_3d0;
  undefined1 local_3c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8 [7];
  ios_base local_348 [8];
  ios_base local_340 [264];
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  stringstream local_1f8 [16];
  undefined1 local_1e8 [376];
  string local_70;
  string local_50;
  
  local_448 = file_options;
  local_3f8 = options;
  pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)malloc(0x200);
  local_3d0 = 0x200;
  local_430 = pvVar11;
  if ((model_file->files)._end == (model_file->files)._begin) goto LAB_002537da;
  local_478 = all;
  version_struct::to_string_abi_cxx11_((string *)local_3c8,&version);
  uVar5 = local_3c8._8_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._0_8_ != local_3b8) {
    operator_delete((void *)local_3c8._0_8_);
  }
  std::__cxx11::stringstream::stringstream(local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"Version ",8);
  version_struct::to_string_abi_cxx11_((string *)local_3c8,&version);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,(char *)local_3c8._0_8_,local_3c8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._0_8_ != local_3b8) {
    operator_delete((void *)local_3c8._0_8_);
  }
  version_struct::to_string_abi_cxx11_((string *)local_3c8,&version);
  uVar4 = local_3c8._0_8_;
  uVar30 = uVar5 + 1;
  uVar10 = 0x200;
  if (uVar30 < 0x200) {
    uVar10 = uVar30;
  }
  memcpy(pvVar11,(void *)local_3c8._0_8_,(ulong)uVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar4 != local_3b8) {
    operator_delete((void *)uVar4);
  }
  if (read) {
    *(bool *)((long)(pvVar11 + 0x15) + 7) = false;
    uVar30 = 0x200;
  }
  if (read) {
    pvVar13 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)bin_read(model_file,(char *)pvVar11,(ulong)uVar30,"");
  }
  else {
    pvVar13 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)bin_text_write(model_file,(char *)pvVar11,(ulong)uVar30,(stringstream *)local_1f8,
                                text);
  }
  pvVar31 = local_478;
  local_438 = &local_478->model_file_ver;
  __isoc99_sscanf(pvVar11,"%d.%d.%d",local_438,&(local_478->model_file_ver).minor,
                  &(local_478->model_file_ver).rev);
  VW::validate_version(pvVar31);
  bVar7 = version_struct::operator>=(local_438,"8.0.2");
  if (bVar7) {
    model_file->_verify_hash = true;
  }
  bVar7 = version_struct::operator>=(local_438,"8.0.3");
  pvVar31 = local_478;
  if (bVar7) {
    sVar3 = (local_478->id)._M_string_length;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"Id ",3);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,(local_478->id)._M_dataplus._M_p,
                         (local_478->id)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    __rhs = &local_478->id;
    uVar30 = (int)sVar3 + 1;
    uVar10 = 0x200;
    if (uVar30 < 0x200) {
      uVar10 = uVar30;
    }
    memcpy(pvVar11,(__rhs->_M_dataplus)._M_p,(ulong)uVar10);
    if (read) {
      sVar14 = bin_read(model_file,(char *)pvVar11,0x200,"");
    }
    else {
      sVar14 = bin_text_write(model_file,(char *)pvVar11,(ulong)uVar30,(stringstream *)local_1f8,
                              text);
    }
    pcVar35 = (char *)(local_478->id)._M_string_length;
    strlen((char *)pvVar11);
    std::__cxx11::string::_M_replace((ulong)__rhs,0,pcVar35,(ulong)pvVar11);
    if (read) {
      local_218[0] = local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"id","");
      iVar8 = (*local_3f8->_vptr_options_i[1])(local_3f8,local_218);
      if ((char)iVar8 != '\0') goto LAB_00251e7b;
      bVar7 = (local_478->id)._M_string_length != 0;
    }
    else {
LAB_00251e7b:
      bVar7 = false;
    }
    if ((read) && (local_218[0] != local_208)) {
      operator_delete(local_218[0]);
    }
    pvVar13 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&(pvVar13->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + sVar14);
    pvVar31 = local_478;
    if (bVar7) {
      std::__cxx11::string::append((char *)local_448);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                     " ",__rhs);
      std::__cxx11::string::_M_append((char *)local_448,local_3c8._0_8_);
      pvVar31 = local_478;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._0_8_ != local_3b8) {
        operator_delete((void *)local_3c8._0_8_);
      }
    }
  }
  local_3f9 = 'm';
  local_480 = CONCAT44(local_480._4_4_,(uint)read);
  local_470 = pvVar13;
  sVar14 = bin_text_read_write_fixed_validated
                     (model_file,&local_3f9,1,"file is not a model file",read,
                      (stringstream *)local_1f8,text);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"Min label:",10);
  poVar12 = std::ostream::_M_insert<double>((double)pvVar31->sd->min_label);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  sVar15 = bin_text_read_write_fixed_validated
                     (model_file,(char *)&pvVar31->sd->min_label,4,"",SUB81(local_480,0),
                      (stringstream *)local_1f8,text);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"Max label:",10);
  poVar12 = std::ostream::_M_insert<double>((double)pvVar31->sd->max_label);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  sVar16 = bin_text_read_write_fixed_validated
                     (model_file,(char *)&pvVar31->sd->max_label,4,"",SUB81(local_480,0),
                      (stringstream *)local_1f8,text);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"bits:",5);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  local_400 = pvVar31->num_bits;
  local_440 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)bin_text_read_write_fixed_validated
                           (model_file,(char *)&local_400,4,"",SUB81(local_480,0),
                            (stringstream *)local_1f8,text);
  if (read) {
    local_238[0] = local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"bit_precision","");
    iVar8 = (*local_3f8->_vptr_options_i[1])(local_3f8,local_238);
    bVar27 = (byte)iVar8 ^ 1;
    if (local_238[0] != local_228) {
      operator_delete(local_238[0]);
    }
  }
  else {
    bVar27 = 0;
  }
  if (bVar27 != 0) {
    std::__cxx11::string::append((char *)local_448);
    std::__cxx11::stringstream::stringstream((stringstream *)local_3c8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_3b8);
    std::__cxx11::stringbuf::str();
    plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x28002c);
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 == paVar21) {
      local_468.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_468.field_2._8_8_ = plVar17[3];
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    }
    else {
      local_468.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_468._M_dataplus._M_p = (pointer)*plVar17;
    }
    local_468._M_string_length = plVar17[1];
    *plVar17 = (long)paVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_448,(ulong)local_468._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p);
    }
    if (local_428 != &local_418) {
      operator_delete(local_428);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3c8);
    std::ios_base::~ios_base((ios_base *)(local_3b8[0]._M_local_buf + 0x70));
  }
  VW::validate_default_bits(pvVar31,local_400);
  pvVar31->default_bits = false;
  pvVar31->num_bits = local_400;
  VW::validate_num_bits(pvVar31);
  bVar7 = version_struct::operator<(local_438,"7.10.3");
  pcVar35 = (char *)((long)&(local_440->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start +
                    (long)((long)&(local_470->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start +
                          sVar16 + sVar15 + sVar14));
  if (bVar7) {
    local_428 = (long *)CONCAT44(local_428._4_4_,
                                 (int)((ulong)((long)(pvVar31->pairs).
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(pvVar31->pairs).
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," pairs: ",8);
    sVar14 = bin_text_read_write_fixed_validated
                       (model_file,(char *)&local_428,4,"",SUB81(local_480,0),
                        (stringstream *)local_1f8,text);
    pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(pcVar35 + sVar14);
    if ((uint)local_428 != 0) {
      local_440 = &pvVar31->pairs;
      uVar29 = 0;
      do {
        local_3f0 = (char *)((ulong)local_3f0 & 0xffffffffff000000);
        if (!read) {
          pbVar1 = (local_440->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pcVar35 = pbVar1[uVar29]._M_dataplus._M_p;
          local_3f0 = (char *)CONCAT62(local_3f0._2_6_,*(undefined2 *)pcVar35);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,pcVar35,pbVar1[uVar29]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        }
        sVar14 = bin_text_read_write_fixed_validated
                           (model_file,(char *)&local_3f0,2,"",SUB81(local_480,0),
                            (stringstream *)local_1f8,text);
        if (read) {
          local_3c8._0_8_ = local_3b8;
          local_470 = pvVar11;
          sVar18 = strlen((char *)&local_3f0);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3c8,&local_3f0,(long)&local_3f0 + sVar18);
          _Var34._M_current =
               (local_478->pairs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (local_478->pairs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_468._M_dataplus._M_p = (pointer)local_3c8;
          if (_Var34._M_current == pbVar1) {
LAB_0025243e:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_440,(value_type *)local_3c8);
          }
          else {
            lVar36 = 0;
            do {
              bVar7 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                                ((_Iter_equals_val<std::__cxx11::string_const> *)&local_468,_Var34);
              lVar36 = lVar36 + (ulong)bVar7;
              _Var34._M_current = _Var34._M_current + 1;
            } while (_Var34._M_current != pbVar1);
            if (lVar36 == 0) goto LAB_0025243e;
          }
          pvVar11 = local_470;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._0_8_ != local_3b8) {
            operator_delete((void *)local_3c8._0_8_);
          }
        }
        pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&(pvVar11->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + sVar14);
        uVar29 = uVar29 + 1;
      } while (uVar29 < ((ulong)local_428 & 0xffffffff));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
    pvVar31 = local_478;
    if (read) {
      sVar14 = 0;
    }
    else {
      sVar14 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1f8,text);
    }
    local_3f0 = (char *)CONCAT44(local_3f0._4_4_,
                                 (int)((ulong)((long)(pvVar31->triples).
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(pvVar31->triples).
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," triples: ",10);
    sVar15 = bin_text_read_write_fixed_validated
                       (model_file,(char *)&local_3f0,4,"",SUB81(local_480,0),
                        (stringstream *)local_1f8,text);
    pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&(pvVar11->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + sVar15 + sVar14);
    if ((int)local_3f0 != 0) {
      pvVar13 = &pvVar31->triples;
      uVar29 = 0;
      local_440 = pvVar13;
      do {
        local_484 = 0;
        if (!read) {
          pbVar1 = (pvVar13->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,pbVar1[uVar29]._M_dataplus._M_p,
                               pbVar1[uVar29]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          pcVar2 = (pvVar13->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar29]._M_dataplus._M_p;
          local_484 = CONCAT22(CONCAT11(local_484._3_1_,pcVar2[2]),*(undefined2 *)pcVar2);
        }
        sVar14 = bin_text_read_write_fixed_validated
                           (model_file,(char *)&local_484,3,"",SUB81(local_480,0),
                            (stringstream *)local_1f8,text);
        if (read) {
          local_3c8._0_8_ = local_3b8;
          sVar18 = strlen((char *)&local_484);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3c8,&local_484,(long)&local_484 + sVar18);
          _Var34._M_current =
               (local_478->triples).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (local_478->triples).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_468._M_dataplus._M_p = (pointer)local_3c8;
          if (_Var34._M_current == pbVar1) {
LAB_00252691:
            pvVar13 = local_440;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_440,(value_type *)local_3c8);
          }
          else {
            lVar36 = 0;
            local_470 = pvVar11;
            do {
              bVar7 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                                ((_Iter_equals_val<std::__cxx11::string_const> *)&local_468,_Var34);
              lVar36 = lVar36 + (ulong)bVar7;
              _Var34._M_current = _Var34._M_current + 1;
            } while (_Var34._M_current != pbVar1);
            pvVar13 = local_440;
            pvVar11 = local_470;
            if (lVar36 == 0) goto LAB_00252691;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._0_8_ != local_3b8) {
            operator_delete((void *)local_3c8._0_8_);
          }
        }
        pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&(pvVar11->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + sVar14);
        uVar29 = uVar29 + 1;
      } while (uVar29 < ((ulong)local_3f0 & 0xffffffff));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
    pvVar31 = local_478;
    if (read) {
      sVar14 = 0;
    }
    else {
      sVar14 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1f8,text);
    }
    bVar7 = version_struct::operator>=(local_438,"7.10.2");
    pcVar35 = (char *)((long)&(pvVar11->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + sVar14);
    if (bVar7) {
      local_468._M_dataplus._M_p._0_4_ =
           (int)((ulong)((long)(pvVar31->interactions).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar31->interactions).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," interactions: ",0xf);
      sVar14 = bin_text_read_write_fixed_validated
                         (model_file,(char *)&local_468,4,"",SUB81(local_480,0),
                          (stringstream *)local_1f8,text);
      pcVar35 = pcVar35 + sVar14;
      if ((uint32_t)local_468._M_dataplus._M_p != 0) {
        local_470 = &pvVar31->interactions;
        local_440 = local_430;
        lVar36 = 0;
        uVar29 = 0;
        do {
          local_484 = 0;
          if (!read) {
            local_484 = *(uint *)((long)&((local_470->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                         _M_string_length + lVar36);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"len: ",5);
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          }
          sVar14 = bin_text_read_write_fixed_validated
                             (model_file,(char *)&local_484,4,"",SUB81(local_480,0),
                              (stringstream *)local_1f8,text);
          if (!read) {
            memcpy(local_440,
                   *(void **)((long)&(((local_470->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar36),(ulong)local_484);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,"interaction: ",0xd);
            std::ostream::write(local_1e8,
                                *(long *)((long)&(((local_470->
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar36));
          }
          sVar15 = bin_text_read_write_fixed_validated
                             (model_file,(char *)local_440,(ulong)local_484,"",SUB81(local_480,0),
                              (stringstream *)local_1f8,text);
          if (read) {
            local_3c8._0_8_ = local_3b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3c8,local_440,
                       (char *)((long)&(local_440->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + (ulong)local_484
                               ));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_470,(value_type *)local_3c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._0_8_ != local_3b8) {
              operator_delete((void *)local_3c8._0_8_);
            }
          }
          pcVar35 = pcVar35 + sVar15 + sVar14;
          uVar29 = uVar29 + 1;
          lVar36 = lVar36 + 0x20;
        } while (uVar29 < ((ulong)local_468._M_dataplus._M_p & 0xffffffff));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
      pvVar31 = local_478;
      if (read) {
        sVar14 = 0;
      }
      else {
        sVar14 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1f8,text);
      }
      pcVar35 = pcVar35 + sVar14;
    }
    else {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pvVar31->interactions,
                 (pvVar31->interactions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (pvVar31->pairs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (pvVar31->pairs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pvVar31->interactions,
                 (pvVar31->interactions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (pvVar31->triples).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (pvVar31->triples).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  bVar7 = version_struct::operator<=(local_438,"7.8.0");
  if (bVar7) {
    local_3f0 = (char *)((ulong)local_3f0 & 0xffffffff00000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"rank:",5);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    sVar14 = bin_text_read_write_fixed_validated
                       (model_file,(char *)&local_3f0,4,"",SUB81(local_480,0),
                        (stringstream *)local_1f8,text);
    if ((int)local_3f0 != 0) {
      local_3c8._0_8_ = local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"rank","");
      iVar8 = (*local_3f8->_vptr_options_i[1])(local_3f8,local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._0_8_ != local_3b8) {
        operator_delete((void *)local_3c8._0_8_);
      }
      if ((char)iVar8 == '\0') {
        std::__cxx11::string::append((char *)local_448);
        std::__cxx11::stringstream::stringstream((stringstream *)local_3c8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_3b8);
        std::__cxx11::stringbuf::str();
        puVar19 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_428,0,(char *)0x0,0x28002c);
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 == paVar21) {
          local_468.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_468.field_2._8_8_ = puVar19[3];
          local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
        }
        else {
          local_468.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_468._M_dataplus._M_p = (pointer)*puVar19;
        }
        local_468._M_string_length = puVar19[1];
        *puVar19 = paVar21;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_448,(ulong)local_468._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p);
        }
        if (local_428 != &local_418) {
          operator_delete(local_428);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_3c8);
        std::ios_base::~ios_base((ios_base *)(local_3b8[0]._M_local_buf + 0x70));
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pvVar31->trace_message).super_ostream,
                   "WARNING: this model file contains \'rank: ",0x29);
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&pvVar31->trace_message);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   "\' value but it will be ignored as another value specified via the command line."
                   ,0x4f);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
      }
    }
    pcVar35 = pcVar35 + sVar14;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"lda:",4);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  sVar14 = bin_text_read_write_fixed_validated
                     (model_file,(char *)&pvVar31->lda,4,"",SUB81(local_480,0),
                      (stringstream *)local_1f8,text);
  local_484 = (uint)((ulong)((long)(pvVar31->ngram_strings).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar31->ngram_strings).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ngram:",7);
  sVar15 = bin_text_read_write_fixed_validated
                     (model_file,(char *)&local_484,4,"",SUB81(local_480,0),
                      (stringstream *)local_1f8,text);
  local_470 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(pcVar35 + sVar15 + sVar14);
  if (local_484 != 0) {
    pvVar11 = &pvVar31->ngram_strings;
    lVar36 = 8;
    uVar29 = 0;
    do {
      local_428 = (long *)((ulong)local_428 & 0xffffffff00000000);
      if (!read) {
        pbVar1 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,*(char **)((long)pbVar1 + lVar36 + -8),
                             *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar36));
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        pbVar1 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar26 = *(ulong *)((long)&(pbVar1->_M_dataplus)._M_p + lVar36);
        if (2 < uVar26) {
          uVar26 = 3;
        }
        memcpy(&local_428,*(void **)((long)pbVar1 + lVar36 + -8),uVar26);
      }
      sVar14 = bin_text_read_write_fixed_validated
                         (model_file,(char *)&local_428,3,"",SUB81(local_480,0),
                          (stringstream *)local_1f8,text);
      if (read) {
        local_3c8._0_8_ = local_3b8;
        sVar18 = strlen((char *)&local_428);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c8,&local_428,(long)&local_428 + sVar18);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar11,(value_type *)local_3c8);
        std::__cxx11::string::append((char *)local_448);
        std::operator+(&local_468," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3c8);
        std::__cxx11::string::_M_append((char *)local_448,(ulong)local_468._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._0_8_ != local_3b8) {
          operator_delete((void *)local_3c8._0_8_);
        }
      }
      local_470 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&(local_470->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + sVar14);
      uVar29 = uVar29 + 1;
      lVar36 = lVar36 + 0x20;
    } while (uVar29 < local_484);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
  pvVar31 = local_478;
  if (read) {
    sVar14 = 0;
  }
  else {
    sVar14 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1f8,text);
  }
  local_404 = (uint)((ulong)((long)(pvVar31->skip_strings).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar31->skip_strings).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," skip:",6);
  sVar15 = bin_text_read_write_fixed_validated
                     (model_file,(char *)&local_404,4,"",SUB81(local_480,0),
                      (stringstream *)local_1f8,text);
  pcVar35 = (char *)((long)&(local_470->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + sVar15 + sVar14);
  iVar8 = (int)pcVar35;
  if (local_404 != 0) {
    local_470 = &pvVar31->skip_strings;
    lVar36 = 8;
    uVar29 = 0;
    do {
      local_428 = (long *)((ulong)local_428 & 0xffffffff00000000);
      if (!read) {
        pbVar1 = (local_470->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,*(char **)((long)pbVar1 + lVar36 + -8),
                             *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar36));
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
        pbVar1 = (local_470->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar26 = *(ulong *)((long)&(pbVar1->_M_dataplus)._M_p + lVar36);
        if (2 < uVar26) {
          uVar26 = 3;
        }
        memcpy(&local_428,*(void **)((long)pbVar1 + lVar36 + -8),uVar26);
      }
      sVar14 = bin_text_read_write_fixed_validated
                         (model_file,(char *)&local_428,3,"",SUB81(local_480,0),
                          (stringstream *)local_1f8,text);
      if (read) {
        local_3c8._0_8_ = local_3b8;
        sVar18 = strlen((char *)&local_428);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c8,&local_428,(long)&local_428 + sVar18);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_470,(value_type *)local_3c8);
        std::__cxx11::string::append((char *)local_448);
        std::operator+(&local_468," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3c8);
        std::__cxx11::string::_M_append((char *)local_448,(ulong)local_468._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._0_8_ != local_3b8) {
          operator_delete((void *)local_3c8._0_8_);
        }
      }
      pcVar35 = pcVar35 + sVar14;
      iVar8 = (int)pcVar35;
      uVar29 = uVar29 + 1;
      lVar36 = lVar36 + 0x20;
    } while (uVar29 < local_404);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
  if (read) {
    local_480 = 0;
    sVar14 = io_buf::bin_read_fixed(model_file,(char *)&local_428,4,"");
    if (sVar14 < 4) {
LAB_002537f6:
      std::__cxx11::stringstream::stringstream((stringstream *)local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b8,"bad model format!",0x11);
      pvVar20 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar20,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                 ,0x1ce,&local_50);
      __cxa_throw(pvVar20,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if (0x6400000 < (uint)local_428) goto LAB_002537f6;
    resize_buf_if_needed((char **)&local_430,&local_3d0,(ulong)local_428 & 0xffffffff);
    sVar15 = io_buf::bin_read_fixed(model_file,(char *)local_430,(ulong)local_428 & 0xffffffff,"");
    if ((uint)local_428 != 0) {
      pcVar2 = (local_448->_M_dataplus)._M_p;
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,pcVar2,pcVar2 + local_448->_M_string_length);
      std::__cxx11::string::append((char *)&local_468);
      plVar17 = (long *)std::__cxx11::string::append((char *)&local_468);
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar17 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar17 == paVar21) {
        local_3b8[0]._0_8_ = paVar21->_M_allocated_capacity;
        local_3b8[0]._8_8_ = plVar17[3];
        local_3c8._0_8_ = local_3b8;
      }
      else {
        local_3b8[0]._0_8_ = paVar21->_M_allocated_capacity;
        local_3c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar17;
      }
      local_3c8._8_8_ = plVar17[1];
      *plVar17 = (long)paVar21;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_448,(string *)local_3c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._0_8_ != local_3b8) {
        operator_delete((void *)local_3c8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p);
      }
    }
    iVar28 = (int)sVar15 + (int)sVar14;
  }
  else {
    local_480 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1f8,text);
    local_3c8._0_8_ = &PTR_add_002d9ab8;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_3c8 + 8));
    pcVar35 = local_3b8[0]._M_local_buf + *(long *)(local_3c8._8_8_ - 0x18);
    pcVar35[0] = '\x0f';
    pcVar35[1] = '\0';
    pcVar35[2] = '\0';
    pcVar35[3] = '\0';
    pcVar35[4] = '\0';
    pcVar35[5] = '\0';
    pcVar35[6] = '\0';
    pcVar35[7] = '\0';
    (*local_3f8->_vptr_options_i[3])(&local_468);
    sVar3 = local_468._M_string_length;
    if (local_468._M_dataplus._M_p != (pointer)local_468._M_string_length) {
      _Var37._M_p = local_468._M_dataplus._M_p;
      do {
        if ((*(char *)(*(size_type *)_Var37._M_p + 0x70) == '\x01') &&
           (iVar28 = (*local_3f8->_vptr_options_i[1])(local_3f8,*(size_type *)_Var37._M_p + 8),
           (char)iVar28 != '\0')) {
          VW::config::options_serializer_boost_po::add
                    ((options_serializer_boost_po *)local_3c8,*(base_option **)_Var37._M_p);
        }
        _Var37._M_p = _Var37._M_p + 0x10;
      } while (_Var37._M_p != (pointer)sVar3);
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
               *)&local_468);
    VW::config::options_serializer_boost_po::str_abi_cxx11_
              (&local_468,(options_serializer_boost_po *)local_3c8);
    if ((local_478->save_resume == true) && (local_478->random_state != 0)) {
      std::__cxx11::string::append((char *)&local_468);
      uVar29 = local_478->random_state;
      cVar32 = '\x01';
      if (9 < uVar29) {
        uVar26 = uVar29;
        cVar6 = '\x04';
        do {
          cVar32 = cVar6;
          if (uVar26 < 100) {
            cVar32 = cVar32 + -2;
            goto LAB_00253428;
          }
          if (uVar26 < 1000) {
            cVar32 = cVar32 + -1;
            goto LAB_00253428;
          }
          if (uVar26 < 10000) goto LAB_00253428;
          bVar7 = 99999 < uVar26;
          uVar26 = uVar26 / 10000;
          cVar6 = cVar32 + '\x04';
        } while (bVar7);
        cVar32 = cVar32 + '\x01';
      }
LAB_00253428:
      local_3f0 = local_3e0;
      std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar32);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_3f0,local_3e8,uVar29);
      plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,0x28002c);
      plVar22 = plVar17 + 2;
      if ((long *)*plVar17 == plVar22) {
        local_418 = *plVar22;
        lStack_410 = plVar17[3];
        local_428 = &local_418;
      }
      else {
        local_418 = *plVar22;
        local_428 = (long *)*plVar17;
      }
      local_420 = plVar17[1];
      *plVar17 = (long)plVar22;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_468,(ulong)local_428);
      if (local_428 != &local_418) {
        operator_delete(local_428);
      }
      if (local_3f0 != local_3e0) {
        operator_delete(local_3f0);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"options:",8);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,local_468._M_dataplus._M_p,local_468._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    _Var37._M_p = local_468._M_dataplus._M_p;
    uVar29 = local_468._M_string_length & 0xffffffff;
    iVar28 = (int)local_468._M_string_length;
    if (uVar29 != 0) {
      uVar26 = (ulong)(iVar28 + 1);
      resize_buf_if_needed((char **)&local_430,&local_3d0,uVar26);
      memcpy(local_430,_Var37._M_p,uVar26);
    }
    *(undefined1 *)
     ((long)&(local_430->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar29) = 0;
    sVar14 = bin_text_write(model_file,(char *)local_430,(ulong)(iVar28 + 1),
                            (stringstream *)local_1f8,text);
    iVar28 = (int)sVar14;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p);
    }
    local_3c8._0_8_ = &PTR_add_002d9ab8;
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_3c8 + 8));
    std::ios_base::~ios_base(local_340);
  }
  bVar7 = version_struct::operator>=(local_438,"8.0.1");
  if (bVar7) {
    bVar7 = version_struct::operator>=(local_438,"8.0.2");
    if (bVar7) {
      uVar9 = io_buf::hash(model_file);
    }
    else {
      uVar10 = (int)local_480 + iVar8 + iVar28;
      uVar30 = uVar10;
      if ((int)uVar10 < 0) {
        uVar30 = uVar10 + 3;
      }
      pbVar23 = (byte *)((model_file->space)._begin + (int)(uVar30 & 0xfffffffc));
      uVar25 = 0;
      uVar24 = 0;
      uVar33 = 0;
      if (6 < uVar10 + 3) {
        lVar36 = (long)-((int)uVar30 >> 2);
        uVar33 = 0;
        do {
          uVar33 = ((uint)(*(int *)(pbVar23 + lVar36 * 4) * -0x3361d2af) >> 0x11 |
                   *(int *)(pbVar23 + lVar36 * 4) * 0x16a88000) * 0x1b873593 ^ uVar33;
          uVar33 = (uVar33 << 0xd | uVar33 >> 0x13) * 5 + 0xe6546b64;
          lVar36 = lVar36 + 1;
        } while (lVar36 != 0);
      }
      switch(uVar10 & 3) {
      case 3:
        uVar24 = (uint)pbVar23[2] << 0x10;
      case 2:
        uVar25 = uVar24 | (uint)pbVar23[1] << 8;
      case 1:
        uVar33 = uVar33 ^ ((*pbVar23 ^ uVar25) * -0x3361d2af >> 0x11 |
                          (*pbVar23 ^ uVar25) * 0x16a88000) * 0x1b873593;
      case 0:
        uVar10 = ((uVar33 ^ uVar10) >> 0x10 ^ uVar33 ^ uVar10) * -0x7a143595;
        uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
        uVar9 = uVar10 >> 0x10 ^ uVar10;
      }
    }
    local_468._M_dataplus._M_p._0_4_ = uVar9;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"Checksum: ",10);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    if (read) {
      bin_read(model_file,(char *)&local_468,4,"");
    }
    else {
      bin_text_write(model_file,(char *)&local_468,4,(stringstream *)local_1f8,text);
    }
    if (uVar9 != (uint32_t)local_468._M_dataplus._M_p) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b8,"Checksum is inconsistent, file is possibly corrupted.",0x35);
      pvVar20 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar20,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                 ,0x20b,&local_70);
      __cxa_throw(pvVar20,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  bVar7 = version_struct::operator>=(local_438,"8.0.2");
  if (bVar7) {
    model_file->_verify_hash = false;
    model_file->_hash = 0;
  }
  std::__cxx11::stringstream::~stringstream(local_1f8);
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
LAB_002537da:
  free(local_430);
  return;
}

Assistant:

void save_load_header(
    vw& all, io_buf& model_file, bool read, bool text, std::string& file_options, VW::config::options_i& options)
{
  char* buff2 = (char*)malloc(default_buf_size);
  size_t buf2_size = default_buf_size;

  try
  {
    if (model_file.files.size() > 0)
    {
      size_t bytes_read_write = 0;

      uint32_t v_length = (uint32_t)version.to_string().length() + 1;
      stringstream msg;
      msg << "Version " << version.to_string() << "\n";
      memcpy(buff2, version.to_string().c_str(), min(v_length, buf2_size));
      if (read)
      {
        v_length = (uint32_t)buf2_size;
        buff2[min(v_length, default_buf_size) - 1] = '\0';
      }
      bytes_read_write += bin_text_read_write(model_file, buff2, v_length, "", read, msg, text);
      all.model_file_ver = buff2;  // stored in all to check save_resume fix in gd
      VW::validate_version(all);

      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_CHAINED_HASH)
        model_file.verify_hash(true);

      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_ID)
      {
        v_length = (uint32_t)all.id.length() + 1;

        msg << "Id " << all.id << "\n";
        memcpy(buff2, all.id.c_str(), min(v_length, default_buf_size));
        if (read)
          v_length = default_buf_size;
        bytes_read_write += bin_text_read_write(model_file, buff2, v_length, "", read, msg, text);
        all.id = buff2;

        if (read && !options.was_supplied("id") && !all.id.empty())
        {
          file_options += " --id";
          file_options += " " + all.id;
        }
      }

      char model = 'm';

      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, &model, 1, "file is not a model file", read, msg, text);

      msg << "Min label:" << all.sd->min_label << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(
          model_file, (char*)&all.sd->min_label, sizeof(all.sd->min_label), "", read, msg, text);

      msg << "Max label:" << all.sd->max_label << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(
          model_file, (char*)&all.sd->max_label, sizeof(all.sd->max_label), "", read, msg, text);

      msg << "bits:" << all.num_bits << "\n";
      uint32_t local_num_bits = all.num_bits;
      bytes_read_write += bin_text_read_write_fixed_validated(
          model_file, (char*)&local_num_bits, sizeof(local_num_bits), "", read, msg, text);

      if (read && !options.was_supplied("bit_precision"))
      {
        file_options += " --bit_precision";
        std::stringstream temp;
        temp << local_num_bits;
        file_options += " " + temp.str();
      }

      VW::validate_default_bits(all, local_num_bits);

      all.default_bits = false;
      all.num_bits = local_num_bits;

      VW::validate_num_bits(all);

      if (all.model_file_ver < VERSION_FILE_WITH_INTERACTIONS_IN_FO)
      {
        // -q, --cubic and --interactions are not saved in vw::file_options
        uint32_t pair_len = (uint32_t)all.pairs.size();

        msg << pair_len << " pairs: ";
        bytes_read_write +=
            bin_text_read_write_fixed_validated(model_file, (char*)&pair_len, sizeof(pair_len), "", read, msg, text);

        // TODO: validate pairs?
        for (size_t i = 0; i < pair_len; i++)
        {
          char pair[3] = {0, 0, 0};

          if (!read)
          {
            memcpy(pair, all.pairs[i].c_str(), 2);
            msg << all.pairs[i] << " ";
          }

          bytes_read_write += bin_text_read_write_fixed_validated(model_file, pair, 2, "", read, msg, text);
          if (read)
          {
            string temp(pair);
            if (count(all.pairs.begin(), all.pairs.end(), temp) == 0)
              all.pairs.push_back(temp);
          }
        }

        msg << "\n";
        bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

        uint32_t triple_len = (uint32_t)all.triples.size();

        msg << triple_len << " triples: ";
        bytes_read_write += bin_text_read_write_fixed_validated(
            model_file, (char*)&triple_len, sizeof(triple_len), "", read, msg, text);

        // TODO: validate triples?
        for (size_t i = 0; i < triple_len; i++)
        {
          char triple[4] = {0, 0, 0, 0};

          if (!read)
          {
            msg << all.triples[i] << " ";
            memcpy(triple, all.triples[i].c_str(), 3);
          }
          bytes_read_write += bin_text_read_write_fixed_validated(model_file, triple, 3, "", read, msg, text);
          if (read)
          {
            string temp(triple);
            if (count(all.triples.begin(), all.triples.end(), temp) == 0)
              all.triples.push_back(temp);
          }
        }

        msg << "\n";
        bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

        if (all.model_file_ver >=
            VERSION_FILE_WITH_INTERACTIONS)  // && < VERSION_FILE_WITH_INTERACTIONS_IN_FO (previous if)
        {
          // the only version that saves interacions among pairs and triples
          uint32_t len = (uint32_t)all.interactions.size();

          msg << len << " interactions: ";
          bytes_read_write +=
              bin_text_read_write_fixed_validated(model_file, (char*)&len, sizeof(len), "", read, msg, text);

          for (size_t i = 0; i < len; i++)
          {
            uint32_t inter_len = 0;
            if (!read)
            {
              inter_len = (uint32_t)all.interactions[i].size();
              msg << "len: " << inter_len << " ";
            }
            bytes_read_write += bin_text_read_write_fixed_validated(
                model_file, (char*)&inter_len, sizeof(inter_len), "", read, msg, text);
            if (!read)
            {
              memcpy(buff2, all.interactions[i].c_str(), inter_len);

              msg << "interaction: ";
              msg.write(all.interactions[i].c_str(), inter_len);
            }

            bytes_read_write += bin_text_read_write_fixed_validated(model_file, buff2, inter_len, "", read, msg, text);

            if (read)
            {
              string temp(buff2, inter_len);
              all.interactions.push_back(temp);
            }
          }

          msg << "\n";
          bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);
        }
        else  // < VERSION_FILE_WITH_INTERACTIONS
        {
          // pairs and triples may be restored but not reflected in interactions
          all.interactions.insert(std::end(all.interactions), std::begin(all.pairs), std::end(all.pairs));
          all.interactions.insert(std::end(all.interactions), std::begin(all.triples), std::end(all.triples));
        }
      }

      if (all.model_file_ver <= VERSION_FILE_WITH_RANK_IN_HEADER)
      {
        // to fix compatibility that was broken in 7.9
        uint32_t rank = 0;
        msg << "rank:" << rank << "\n";
        bytes_read_write +=
            bin_text_read_write_fixed_validated(model_file, (char*)&rank, sizeof(rank), "", read, msg, text);
        if (rank != 0)
        {
          if (!options.was_supplied("rank"))
          {
            file_options += " --rank";
            std::stringstream temp;
            temp << rank;
            file_options += " " + temp.str();
          }
          else
            all.trace_message << "WARNING: this model file contains 'rank: " << rank
                              << "' value but it will be ignored as another value specified via the command line."
                              << endl;
        }
      }

      msg << "lda:" << all.lda << "\n";
      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, (char*)&all.lda, sizeof(all.lda), "", read, msg, text);

      // TODO: validate ngram_len?
      uint32_t ngram_len = (uint32_t)all.ngram_strings.size();
      msg << ngram_len << " ngram:";
      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, (char*)&ngram_len, sizeof(ngram_len), "", read, msg, text);
      for (size_t i = 0; i < ngram_len; i++)
      {
        // have '\0' at the end for sure
        char ngram[4] = {0, 0, 0, 0};
        if (!read)
        {
          msg << all.ngram_strings[i] << " ";
          memcpy(ngram, all.ngram_strings[i].c_str(), min(3, all.ngram_strings[i].size()));
        }
        bytes_read_write += bin_text_read_write_fixed_validated(model_file, ngram, 3, "", read, msg, text);
        if (read)
        {
          std::string temp(ngram);
          all.ngram_strings.push_back(temp);

          file_options += " --ngram";
          file_options += " " + temp;
        }
      }

      msg << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

      // TODO: validate skips?
      uint32_t skip_len = (uint32_t)all.skip_strings.size();
      msg << skip_len << " skip:";
      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, (char*)&skip_len, sizeof(skip_len), "", read, msg, text);

      for (size_t i = 0; i < skip_len; i++)
      {
        char skip[4] = {0, 0, 0, 0};
        if (!read)
        {
          msg << all.skip_strings[i] << " ";
          memcpy(skip, all.skip_strings[i].c_str(), min(3, all.skip_strings[i].size()));
        }

        bytes_read_write += bin_text_read_write_fixed_validated(model_file, skip, 3, "", read, msg, text);
        if (read)
        {
          std::string temp(skip);
          all.skip_strings.push_back(temp);

          file_options += " --skips";
          file_options += " " + temp;
        }
      }
      msg << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

      if (read)
      {
        uint32_t len;
        size_t ret = model_file.bin_read_fixed((char*)&len, sizeof(len), "");
        if (len > 104857600 /*sanity check: 100 Mb*/ || ret < sizeof(uint32_t))
          THROW("bad model format!");
        resize_buf_if_needed(buff2, buf2_size, len);
        bytes_read_write += model_file.bin_read_fixed(buff2, len, "") + ret;

        // Write out file options to caller.
        if (len > 0)
        {
          // There is a potential bug here if len is read out to be zero (e.g. corrupted file). If we naively
          // append buff2 into file_options it might contain old information and thus be invalid. Before, what
          // probably happened is boost::program_options did the right thing, but now we have to construct the
          // input to it where we do not know whether a particular option key can have multiple values or not.
          //
          // In some cases we end up with a string like: "--bit_precision 18 <something_not_an_int>", which will
          // cause a "bad program options value" exception, rather than the true "file is corrupted" issue. Only
          // pushing the contents of buff2 into file_options when it is valid will prevent this false error.
          file_options = file_options + " " + buff2;
        }
      }
      else
      {
        VW::config::options_serializer_boost_po serializer;
        for (auto const& option : options.get_all_options())
        {
          if (option->m_keep && options.was_supplied(option->m_name))
          {
            serializer.add(*option);
          }
        }

        auto serialized_keep_options = serializer.str();

        // We need to save our current PRG state
        if (all.save_resume && all.random_state != 0)
        {
          serialized_keep_options += " --random_seed";
          serialized_keep_options += " " + std::to_string(all.random_state);
        }

        msg << "options:" << serialized_keep_options << "\n";

        uint32_t len = (uint32_t)serialized_keep_options.length();
        if (len > 0)
          safe_memcpy(buff2, buf2_size, serialized_keep_options.c_str(), len + 1);
        *(buff2 + len) = 0;
        bytes_read_write += bin_text_read_write(model_file, buff2, len + 1,  // len+1 to write a \0
            "", read, msg, text);
      }

      // Read/write checksum if required by version
      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_HASH)
      {
        uint32_t check_sum = (all.model_file_ver >= VERSION_FILE_WITH_HEADER_CHAINED_HASH)
            ? model_file.hash()
            : (uint32_t)uniform_hash(model_file.space.begin(), bytes_read_write, 0);

        uint32_t check_sum_saved = check_sum;

        msg << "Checksum: " << check_sum << "\n";
        bin_text_read_write(model_file, (char*)&check_sum, sizeof(check_sum), "", read, msg, text);

        if (check_sum_saved != check_sum)
          THROW("Checksum is inconsistent, file is possibly corrupted.");
      }

      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_CHAINED_HASH)
      {
        model_file.verify_hash(false);
      }
    }
  }
  catch (...)
  {
    free(buff2);
    throw;
  }

  free(buff2);
}